

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_NodeStore * UA_NodeStore_new(void)

{
  UA_UInt16 UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_NodeStore *ns;
  
  ns = (UA_NodeStore *)malloc(0x18);
  if (ns == (UA_NodeStore *)0x0) {
    ns = (UA_NodeStore *)0x0;
  }
  else {
    UVar1 = higher_prime_index(0x40);
    ns->sizePrimeIndex = (uint)UVar1;
    ns->size = primes[ns->sizePrimeIndex];
    ns->count = 0;
    ppUVar2 = (UA_NodeStoreEntry **)calloc((ulong)ns->size,8);
    ns->entries = ppUVar2;
    if (ns->entries == (UA_NodeStoreEntry **)0x0) {
      free(ns);
      ns = (UA_NodeStore *)0x0;
    }
  }
  return ns;
}

Assistant:

UA_NodeStore *
UA_NodeStore_new(void) {
    UA_NodeStore *ns = UA_malloc(sizeof(UA_NodeStore));
    if(!ns)
        return NULL;
    ns->sizePrimeIndex = higher_prime_index(UA_NODESTORE_MINSIZE);
    ns->size = primes[ns->sizePrimeIndex];
    ns->count = 0;
    ns->entries = UA_calloc(ns->size, sizeof(UA_NodeStoreEntry*));
    if(!ns->entries) {
        UA_free(ns);
        return NULL;
    }
    return ns;
}